

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
md::AddressInRegister::getAdditionnalData
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          AddressInRegister *this)

{
  ushort uVar1;
  undefined4 in_EAX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *offset_bytes;
  undefined8 local_18;
  
  uVar1 = this->_offset;
  if (uVar1 == 0) {
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_18 = (ulong)CONCAT24(uVar1 >> 8,in_EAX);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<int>
              (__return_storage_ptr__,(int *)((long)&local_18 + 4));
    local_18 = CONCAT44(local_18._4_4_,(uint)(byte)this->_offset);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<int>
              (__return_storage_ptr__,(int *)&local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::vector<uint8_t> getAdditionnalData() const override
    {
        if (_offset > 0)
        {
            std::vector<uint8_t> offset_bytes;
            offset_bytes.emplace_back((_offset >> 8) & 0xFF);
            offset_bytes.emplace_back(_offset & 0xFF);
            return offset_bytes;
        }
        else return {};
    }